

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# injected.h
# Opt level: O1

ptr_type * __thiscall
inject::context<0>::injected<Inject::variable>::ptr(injected<Inject::variable> *this)

{
  undefined1 auVar1 [8];
  shared_count sVar2;
  variable *__tmp;
  undefined1 local_30 [8];
  shared_count sStack_28;
  element_type *local_20;
  shared_count local_18;
  
  if ((this->_ptr).px == (element_type *)0x0) {
    get_current();
    instance<Inject::variable>((context<0> *)local_30);
    sVar2.pi_ = sStack_28.pi_;
    auVar1 = local_30;
    local_30 = (undefined1  [8])0x0;
    sStack_28.pi_ = (sp_counted_base *)0x0;
    local_20 = (this->_ptr).px;
    (this->_ptr).px = (element_type *)auVar1;
    local_18.pi_ = (this->_ptr).pn.pi_;
    (this->_ptr).pn.pi_ = sVar2.pi_;
    boost::detail::shared_count::~shared_count(&local_18);
    boost::detail::shared_count::~shared_count(&sStack_28);
  }
  return &this->_ptr;
}

Assistant:

const ptr_type& ptr() const {
      if (_ptr.get() == 0) {
        *const_cast<ptr_type*>(&_ptr) =
          context<ID>::get_current().template instance<T>();
      }
      return _ptr;
    }